

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

void sqlcheck::CheckSelectStar(Configuration *state,string *sql_statement,bool *print_statement)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  string message3;
  string message2;
  string message1;
  string title;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  regex pattern;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&pattern,"(select\\s+\\*)",0x10);
  title._M_dataplus._M_p = (pointer)&title.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&title,"SELECT *","");
  message1._M_dataplus._M_p = (pointer)&message1.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&message1,anon_var_dwarf_d0467,anon_var_dwarf_d0467 + 0x205);
  message2._M_dataplus._M_p = (pointer)&message2.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&message2,anon_var_dwarf_d0482,anon_var_dwarf_d0482 + 0x2c1);
  message3._M_dataplus._M_p = (pointer)&message3.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&message3,anon_var_dwarf_d049d,anon_var_dwarf_d049d + 0x2d6);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,message1._M_dataplus._M_p,
             message1._M_dataplus._M_p + message1._M_string_length);
  std::__cxx11::string::append((char *)local_f0);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_f0,(ulong)message2._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_a0 = *plVar2;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
    local_b0 = (long *)*plVar1;
  }
  local_a8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_80 = *plVar2;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)message3._M_dataplus._M_p);
  message._M_dataplus._M_p = (pointer)&message.field_2;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar3) {
    message.field_2._M_allocated_capacity = *psVar3;
    message.field_2._8_8_ = plVar1[3];
  }
  else {
    message.field_2._M_allocated_capacity = *psVar3;
    message._M_dataplus._M_p = (pointer)*plVar1;
  }
  message._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,title._M_dataplus._M_p,
             title._M_dataplus._M_p + title._M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,message._M_dataplus._M_p,
             message._M_dataplus._M_p + message._M_string_length);
  CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_HIGH,PATTERN_TYPE_QUERY,
               &local_d0,&local_70,true,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message._M_dataplus._M_p != &message.field_2) {
    operator_delete(message._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message3._M_dataplus._M_p != &message3.field_2) {
    operator_delete(message3._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message2._M_dataplus._M_p != &message2.field_2) {
    operator_delete(message2._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message1._M_dataplus._M_p != &message1.field_2) {
    operator_delete(message1._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)title._M_dataplus._M_p != &title.field_2) {
    operator_delete(title._M_dataplus._M_p);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  return;
}

Assistant:

void CheckSelectStar(Configuration& state,
                     const std::string& sql_statement,
                     bool& print_statement){

  std::regex pattern("(select\\s+\\*)");
  std::string title = "SELECT *";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;

  std::string message1 =
      "● Inefficiency in moving data to the consumer:  "
      "When you SELECT *, you're often retrieving more columns from the database than "
      "your application really needs to function. This causes more data to move from "
      "the database server to the client, slowing access and increasing load on your "
      "machines, as well as taking more time to travel across the network. This is "
      "especially true when someone adds new columns to underlying tables that didn't "
      "exist and weren't needed when the original consumers coded their data access.";

  std::string message2 =
      "● Indexing issues:  "
      "Consider a scenario where you want to tune a query to a high level of performance. "
      "If you were to use *, and it returned more columns than you actually needed, "
      "the server would often have to perform more expensive methods to retrieve your "
      "data than it otherwise might. For example, you wouldn't be able to create an index "
      "which simply covered the columns in your SELECT list, and even if you did "
      "(including all columns [shudder]), the next guy who came around and added a column "
      "to the underlying table would cause the optimizer to ignore your optimized covering "
      "index, and you'd likely find that the performance of your query would drop "
      "substantially for no readily apparent reason.";

  std::string message3 =
      "● Binding Problems:  "
      "When you SELECT *, it's possible to retrieve two columns of the same name from two "
      "different tables. This can often crash your data consumer. Imagine a query that joins "
      "two tables, both of which contain a column called \"ID\". How would a consumer know "
      "which was which? SELECT * can also confuse views (at least in some versions SQL Server) "
      "when underlying table structures change -- the view is not rebuilt, and the data which "
      "comes back can be nonsense. And the worst part of it is that you can take care to name "
      "your columns whatever you want, but the next guy who comes along might have no way of "
      "knowing that he has to worry about adding a column which will collide with your "
      "already-developed names.";

  auto message = message1 + "\n" + message2 + "\n" + message3;

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_HIGH,
               pattern_type,
               title,
               message,
               true);

}